

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v7::
     print<char[14],diy::DynamicPoint<float,4ul>const&,diy::DynamicPoint<float,4ul>const&,char>
               (char (*format_str) [14],DynamicPoint<float,_4UL> *args,
               DynamicPoint<float,_4UL> *args_1)

{
  basic_string_view<char> format_str_00;
  format_args args_00;
  DynamicPoint<float,_4UL> *local_28;
  code *local_20;
  DynamicPoint<float,_4UL> *local_18;
  code *local_10;
  
  local_20 = detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<diy::DynamicPoint<float,4ul>,fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>>
  ;
  local_10 = detail::
             value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>>::
             format_custom_arg<diy::DynamicPoint<float,4ul>,fmt::v7::detail::fallback_formatter<diy::DynamicPoint<float,4ul>,char,void>>
  ;
  local_28 = args;
  local_18 = args_1;
  format_str_00 = to_string_view<char,_0>(*format_str);
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       &local_28;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0xff;
  vprint(format_str_00,args_00);
  return;
}

Assistant:

inline void print(const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(to_string_view(format_str), vargs)
             : detail::vprint_mojibake(stdout, to_string_view(format_str),
                                       vargs);
}